

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::confirm::~confirm(confirm *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  text *in_stack_fffffffffffffd98;
  env *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdf4;
  int n;
  text *in_stack_fffffffffffffdf8;
  allocator local_1a1;
  string local_1a0 [32];
  undefined1 local_180 [72];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [39];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  if (*(int *)((long)in_RDI + 100) < 1) {
    bVar1 = env::pass((env *)(in_RDI + 1));
    n = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdf4);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)*in_RDI,"All ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0xc));
      poVar2 = std::operator<<(poVar2," selected ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"test",(allocator *)(local_180 + 0x47));
      std::__cxx11::string::string(local_118,local_138);
      pluralise(in_stack_fffffffffffffdf8,n);
      poVar2 = std::operator<<(poVar2,local_f8);
      poVar2 = std::operator<<(poVar2," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a0,"passed.\n",&local_1a1);
      in_stack_fffffffffffffda0 = (env *)local_180;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffda0,local_1a0);
      colourise(in_stack_fffffffffffffd98);
      std::operator<<(poVar2,(string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)(local_180 + 0x20));
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string(local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)(local_180 + 0x47));
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((void *)*in_RDI,*(int *)((long)in_RDI + 100));
    poVar2 = std::operator<<(poVar2," out of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0xc));
    poVar2 = std::operator<<(poVar2," selected ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"test",&local_69);
    std::__cxx11::string::string(local_48,local_68);
    pluralise(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    poVar2 = std::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"failed.\n",&local_d1);
    std::__cxx11::string::string(local_b0,local_d0);
    colourise(in_stack_fffffffffffffd98);
    std::operator<<(poVar2,local_90);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  env::~env(in_stack_fffffffffffffda0);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }